

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O2

void TryAllocMightFail(size_t size)

{
  code cVar1;
  code cVar2;
  code *pcVar3;
  size_t i;
  long lVar4;
  code *pcVar5;
  code *local_20;
  
  local_20 = malloc;
  (*noopt_helper)(&local_20);
  pcVar3 = (code *)(*local_20)(size);
  if (pcVar3 != (code *)0x0) {
    pcVar5 = pcVar3;
    for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
      *pcVar5 = SUB81(lVar4,0);
      pcVar5 = pcVar5 + (size >> 10);
    }
    lVar4 = -0x400;
    pcVar5 = pcVar3;
    while (lVar4 != 0) {
      cVar2 = SUB81(lVar4,0);
      cVar1 = *pcVar5;
      lVar4 = lVar4 + 1;
      pcVar5 = pcVar5 + (size >> 10);
      if (cVar2 != cVar1) {
        syscall(1,2,"Check failed: p[i * (size / kPoints)] == static_cast<unsigned char>(i)\n",0x47)
        ;
        abort();
      }
    }
    pcVar3[size - 1] = (code)0x4d;
  }
  local_20 = pcVar3;
  (*noopt_helper)(&local_20);
  free(local_20);
  return;
}

Assistant:

void TryAllocMightFail(size_t size) {
  unsigned char* p = static_cast<unsigned char*>(noopt(malloc)(size));
  if (p != nullptr) {
    static const size_t kPoints = 1024;

    for ( size_t i = 0; i < kPoints; ++i ) {
      p[i * (size / kPoints)] = static_cast<unsigned char>(i);
    }

    for ( size_t i = 0; i < kPoints; ++i ) {
      CHECK(p[i * (size / kPoints)] == static_cast<unsigned char>(i));
    }

    p[size-1] = 'M';
    CHECK(p[size-1] == 'M');
  }

  free(noopt(p));
}